

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRProjectionNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRProjectionNode::VRProjectionNode
          (VRProjectionNode *this,string *name,float fovX,float fovY,float nearClip,float farClip)

{
  value_type *__x;
  allocator<char> *in_RDI;
  allocator<char> *__s;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  double dVar3;
  float in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  VRMatrix4 projMat;
  float degreeToRadian;
  VRMatrix4 *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  value_type *in_stack_fffffffffffffed8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee0;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_stack_fffffffffffffee8;
  VRDisplayNode *in_stack_fffffffffffffef0;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  VRDisplayNode *in_stack_ffffffffffffff20;
  undefined1 local_a1 [40];
  allocator<char> local_79;
  string local_78 [39];
  allocator<char> local_51;
  string local_50 [48];
  undefined4 local_20;
  undefined4 local_1c;
  float local_18;
  float local_14;
  
  local_20 = in_XMM3_Da;
  local_1c = in_XMM2_Da;
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  VRDisplayNode::VRDisplayNode(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  *(undefined ***)in_RDI = &PTR__VRProjectionNode_001bd808;
  *(float *)(in_RDI + 0x70) = local_14;
  *(float *)(in_RDI + 0x74) = local_18;
  *(undefined4 *)(in_RDI + 0x78) = local_1c;
  *(undefined4 *)(in_RDI + 0x7c) = local_20;
  __s = in_RDI + 0x88;
  VRMatrix4::VRMatrix4((VRMatrix4 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(char *)__s,in_RDI);
  VRDisplayNode::_addValueNeeded
            (in_stack_ffffffffffffff20,
             (string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             SUB41((uint)in_stack_ffffffffffffff14 >> 0x18,0));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(char *)__s,in_RDI);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  __x = (value_type *)(in_RDI + 0x40);
  this_00 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),(char *)__s,in_RDI);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,__x);
  std::__cxx11::string::~string((string *)(local_a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a1);
  dVar3 = std::tan((double)(ulong)(uint)(local_14 * 0.017453292 * 0.5));
  fVar1 = SUB84(dVar3,0);
  *(float *)(in_RDI + 0x80) = fVar1 * *(float *)(in_RDI + 0x78);
  dVar3 = std::tan((double)(ulong)(uint)(local_18 * 0.017453292 * 0.5));
  fVar2 = SUB84(dVar3,0);
  *(float *)(in_RDI + 0x84) = fVar2 * *(float *)(in_RDI + 0x78);
  VRMatrix4::projection
            (in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,
             in_stack_ffffffffffffff10,(float)((ulong)__s >> 0x20),SUB84(__s,0));
  VRMatrix4::operator=((VRMatrix4 *)CONCAT44(fVar1,fVar2),in_stack_fffffffffffffec8);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xffffffffffffff10);
  return;
}

Assistant:

VRProjectionNode::VRProjectionNode(const std::string &name, float fovX, float fovY, float nearClip, float farClip):
  VRDisplayNode(name), _fovX(fovX), _fovY(fovY), _nearClip(nearClip), _farClip(farClip)
{
  // in:
  _addValueNeeded("CameraMatrix");
  // These should be recorded as necessary, and the auditValues()
  // method needs to be changed to accommodate not just the values
  // added by nodes in teh display tree, but also from the config
  // files.
  //_addValueNeeded("NearClip");
  // _addValueNeeded("FarClip");
  // _addValueNeeded("FieldOfViewY");
  // _addValueNeeded("FieldOfViewX");

  // out:
  _valuesAdded.push_back("ViewMatrix");
  _valuesAdded.push_back("ProjectionMatrix");

  float degreeToRadian = 3.1415926f / 180;
  _horizontalClip = tan(fovX * degreeToRadian / 2.0f) * _nearClip;
  _verticalClip = tan(fovY * degreeToRadian / 2.0f) * _nearClip;

  VRMatrix4 projMat = VRMatrix4::projection(-_horizontalClip, _horizontalClip, -_verticalClip, _verticalClip, _nearClip, _farClip); //TODO: This should just be cacheable once since it doesn't change.
 _projectionMatrix = projMat;


}